

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O0

int cgpr_mt(custom_function *funcpt,custom_gradient *funcgrad,double *xc,int N,double *dx,
           double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,double xtol,
           double *xf)

{
  bool bVar1;
  double dVar2;
  double local_100;
  double alpha;
  double dt2;
  double dt1;
  double fo;
  double eps2;
  double fxf;
  double fsval;
  double *apk;
  double *jacf;
  double *jac;
  double *pk;
  double *rk;
  double *temp;
  double *xi;
  int local_88;
  int siter;
  int gfdcode;
  int restart;
  int k;
  int retval;
  int rcode;
  int i;
  double xtol_local;
  double ftol_local;
  double gtol_local;
  double eps_local;
  double dStack_48;
  int MAXITER_local;
  double maxstep_local;
  double *dx_local;
  double *pdStack_30;
  int N_local;
  double *xc_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  _rcode = xtol;
  xtol_local = ftol;
  ftol_local = gtol;
  gtol_local = eps;
  eps_local._4_4_ = MAXITER;
  dStack_48 = maxstep;
  maxstep_local = (double)dx;
  dx_local._4_4_ = N;
  pdStack_30 = xc;
  xc_local = (double *)funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  rk = (double *)malloc(0x40);
  pk = (double *)malloc((long)dx_local._4_4_ << 3);
  jac = (double *)malloc((long)dx_local._4_4_ << 3);
  fsval = (double)malloc((long)dx_local._4_4_ << 3);
  jacf = (double *)malloc((long)dx_local._4_4_ << 3);
  apk = (double *)malloc((long)dx_local._4_4_ << 3);
  temp = (double *)malloc((long)dx_local._4_4_ << 3);
  *niter = 0;
  gfdcode = 0;
  k = 0;
  siter = dx_local._4_4_;
  xi._4_4_ = eps_local._4_4_;
  fo = sqrt(gtol_local);
  local_88 = 0;
  fxf = 1.0;
  local_100 = 1.0;
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    temp[retval] = pdStack_30[retval];
  }
  if (dStack_48 <= 0.0) {
    dStack_48 = 1000.0;
    alpha = 0.0;
    dt2 = 0.0;
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      dt2 = *(double *)((long)maxstep_local + (long)retval * 8) *
            *(double *)((long)maxstep_local + (long)retval * 8) + dt2;
      alpha = *(double *)((long)maxstep_local + (long)retval * 8) * temp[retval] *
              *(double *)((long)maxstep_local + (long)retval * 8) * temp[retval] + alpha;
    }
    dt2 = sqrt(dt2);
    alpha = sqrt(alpha);
    dVar2 = alpha;
    if (alpha < dt2) {
      dVar2 = dt2;
    }
    dStack_48 = dVar2 * dStack_48;
  }
  local_88 = grad_fd((custom_function *)funcgrad_local,(custom_gradient *)xc_local,temp,
                     dx_local._4_4_,(double *)maxstep_local,fo,jacf);
  if (local_88 == 0xf) {
    k = 0xf;
  }
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    jac[retval] = -jacf[retval];
    xf[retval] = temp[retval];
  }
  eps2 = (double)(*funcgrad_local->funcgrad)
                           (temp,dx_local._4_4_,(double *)funcgrad_local->params,funcgrad_local);
  if ((1.79769313486232e+308 <= eps2) || (eps2 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    k = 0xf;
  }
  if (NAN(eps2)) {
    printf("Program Exiting as the function returns NaN");
    k = 0xf;
  }
  if (siter < dx_local._4_4_) {
    siter = dx_local._4_4_;
  }
  while( true ) {
    bVar1 = false;
    if (k == 0) {
      bVar1 = *niter < xi._4_4_;
    }
    dt1 = eps2;
    if (!bVar1) goto LAB_001502bc;
    *niter = *niter + 1;
    gfdcode = gfdcode + 1;
    mmult(jacf,jacf,rk,1,dx_local._4_4_,1);
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      apk[retval] = jacf[retval];
    }
    restart = lnsrchmt((custom_function *)funcgrad_local,(custom_gradient *)xc_local,temp,&eps2,jacf
                       ,&local_100,jac,dx_local._4_4_,(double *)maxstep_local,dStack_48,
                       eps_local._4_4_,fo,xtol_local,ftol_local,_rcode,xf);
    if (restart == 100) break;
    mmult(jacf,jacf,rk + 1,1,dx_local._4_4_,1);
    mmult(apk,jacf,rk + 3,1,dx_local._4_4_,1);
    rk[2] = (rk[1] - rk[3]) / *rk;
    if (rk[2] <= 0.0 && rk[2] != 0.0) {
      rk[2] = 0.0;
    }
    if (gfdcode == siter) {
      for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
        jac[retval] = -jacf[retval];
      }
      gfdcode = 0;
    }
    else {
      for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
        jac[retval] = rk[2] * jac[retval] + -jacf[retval];
      }
    }
    k = stopcheck2_mt(eps2,dx_local._4_4_,dt1,jacf,(double *)maxstep_local,gtol_local,ftol_local,
                      xtol_local,restart);
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      temp[retval] = xf[retval];
    }
  }
  printf("The Linesearch Algorithm didn\'t converge");
LAB_001502bc:
  if ((k == 0) && (xi._4_4_ <= *niter)) {
    k = 4;
  }
  free(rk);
  free(pk);
  free(jac);
  free(jacf);
  free((void *)fsval);
  free(apk);
  free(temp);
  return k;
}

Assistant:

int cgpr_mt(custom_function *funcpt, custom_gradient *funcgrad, double *xc, int N, double *dx,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int i, rcode, retval, k, restart,gfdcode;
	int siter;
	double *xi,*temp, *rk, *pk, *jac, *jacf, *apk;
	double fsval,fxf,eps2,fo;
	double dt1, dt2,alpha;

	temp = (double*)malloc(sizeof(double)* 8);
	rk = (double*)malloc(sizeof(double)*N);
	pk = (double*)malloc(sizeof(double)*N);
	apk = (double*)malloc(sizeof(double)*N);
	jac = (double*)malloc(sizeof(double)*N);
	jacf = (double*)malloc(sizeof(double)*N);
	xi = (double*)malloc(sizeof(double)*N);

	*niter = 0;
	k = 0;
	rcode = 0;
	restart = N;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//xtol = 1.0e-15;
	//ftol = 1e-10;
	//gtol = 1e-05;

	// Values that may not be needed

	fsval = 1.0;
	alpha = 1.0;

	for (i = 0; i < N; ++i) {
		xi[i] = xc[i];
	}
	
	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);
		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}



	gfdcode = grad_fd(funcpt,funcgrad, xi, N, dx,eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	for (i = 0; i < N; ++i) {
		pk[i] = -jac[i];
		xf[i] = xi[i];
	}

	fxf = FUNCPT_EVAL(funcpt,xi, N);

	if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fxf != fxf) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	if (restart < N) {
		restart = N;
	}

	fo = fxf;


	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		k++;

		mmult(jac, jac, temp, 1, N, 1);
		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		retval = lnsrchmt(funcpt,funcgrad, xi,&fxf,jac,&alpha, pk, N, dx, maxstep,MAXITER,eps2, ftol, gtol, xtol, xf);
		if (retval == 100) {
			printf("The Linesearch Algorithm didn't converge");
			break;
		}
		//mdisplay(xf,1,N);
		
		//mdisplay(xf, 1, N);
		//grad_fd(funcpt, xf, N, dx, jacf);
		mmult(jac, jac, temp + 1, 1, N, 1);
		mmult(jacf, jac, temp + 3, 1, N, 1);
		temp[2] = (temp[1] - temp[3]) / temp[0]; // beta

		if (temp[2] < 0) {
			temp[2] = 0;
		}
		if (k == restart) {
			for (i = 0; i < N; ++i) {
				pk[i] = -jac[i];
			}
			k = 0;
		}
		else {
			for (i = 0; i < N; ++i) {
				pk[i] = temp[2] * pk[i] - jac[i];
			}
		}
		

		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		fo = fxf;
		for (i = 0; i < N; ++i) {
			xi[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	free(temp);
	free(rk);
	free(pk);
	free(jac);
	free(apk);
	free(jacf);
	free(xi);

	return rcode;
}